

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeTestTest.cpp
# Opt level: O3

void __thiscall SafeTestTest::SafeTestTest(SafeTestTest *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 local_c9;
  shared_ptr<oout::EqualMatch> local_c8;
  shared_ptr<oout::FunctionText> local_b8;
  undefined1 local_a8 [16];
  _Manager_type local_98;
  code *local_90;
  shared_ptr<oout::MatchTest> local_80;
  shared_ptr<oout::SafeTest> local_70;
  shared_ptr<TestText> local_60;
  shared_ptr<const_oout::NamedTest> local_50;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SafeTest test","");
  local_b8.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001972f8;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/test/SafeTestTest.cpp:22:7)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/test/SafeTestTest.cpp:22:7)>
             ::_M_manager;
  oout::FunctionText::FunctionText
            ((FunctionText *)(p_Var1 + 1),
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)local_a8);
  if (local_98 != (_Manager_type)0x0) {
    (*local_98)((_Any_data *)local_a8,(_Any_data *)local_a8,__destroy_functor);
  }
  local_a8._0_8_ = (void *)0x0;
  local_b8.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (FunctionText *)(p_Var1 + 1);
  local_b8.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualMatch,std::allocator<oout::EqualMatch>,char_const(&)[5]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),(EqualMatch **)local_a8,
             (allocator<oout::EqualMatch> *)&local_c8,(char (*) [5])"Good");
  local_80.super___shared_ptr<oout::MatchTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::MatchTest,std::allocator<oout::MatchTest>,std::shared_ptr<oout::FunctionText>,std::shared_ptr<oout::EqualMatch>>
            (&local_80.super___shared_ptr<oout::MatchTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MatchTest **)&local_80,(allocator<oout::MatchTest> *)&local_c8,&local_b8,
             (shared_ptr<oout::EqualMatch> *)local_a8);
  local_70.super___shared_ptr<oout::SafeTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::SafeTest,std::allocator<oout::SafeTest>,std::shared_ptr<oout::MatchTest>>
            (&local_70.super___shared_ptr<oout::SafeTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (SafeTest **)&local_70,(allocator<oout::SafeTest> *)&local_c8,&local_80);
  local_60.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestText,std::allocator<TestText>,std::shared_ptr<oout::SafeTest>>
            (&local_60.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestText **)&local_60,(allocator<TestText> *)&local_c8,&local_70);
  local_c8.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualMatch,std::allocator<oout::EqualMatch>,char_const(&)[6]>
            (&local_c8.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualMatch **)&local_c8,(allocator<oout::EqualMatch> *)&local_c9,
             (char (*) [6])0x17cdd7);
  local_50.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[46],std::shared_ptr<TestText>,std::shared_ptr<oout::EqualMatch>>
            (&local_50.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_50,(allocator<oout::NamedTest> *)&local_c9,
             (char (*) [46])"SafeTest produce error if exceprion are throw",&local_60,&local_c8);
  oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_40,&local_50);
  if (local_50.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c8.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_60.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_70.super___shared_ptr<oout::SafeTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<oout::SafeTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_80.super___shared_ptr<oout::MatchTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<oout::MatchTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  if (local_b8.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00197938;
  return;
}

Assistant:

SafeTestTest::SafeTestTest()
: dirty::Test(
	"SafeTest test",
	make_shared<const NamedTest>(
		"SafeTest produce error if exceprion are throw",
		make_shared<TestText>(
			make_shared<SafeTest>(
				make_shared<MatchTest>(
					make_shared<FunctionText>(
						[]() -> string {
							throw runtime_error("Shit");
						}
					),
					make_shared<EqualMatch>("Good")  // Not happen
				)
			)
		),
		make_shared<EqualMatch>("error")
	)
)
{
}